

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

Symbol __thiscall
google::protobuf::DescriptorPool::Tables::FindByNameHelper
          (Tables *this,DescriptorPool *pool,StringPiece name)

{
  DescriptorPool *pool_00;
  bool bVar1;
  int iVar2;
  char *str;
  char *pcVar3;
  __node_base_ptr p_Var4;
  Symbol SVar5;
  char *pcVar6;
  _Hash_node_base *p_Var7;
  size_type sVar8;
  __hash_code _Var9;
  char *pcVar10;
  WrappedMutex *mu;
  MutexLockMaybe __mutex;
  StringPiece SVar11;
  MutexLockMaybe lock;
  key_type local_78;
  MutexLockMaybe local_70;
  Symbol local_68;
  _Hashtable<google::protobuf::Symbol,_google::protobuf::Symbol,_std::allocator<google::protobuf::Symbol>,_std::__detail::_Identity,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_60;
  SymbolBase local_58 [8];
  char *local_50;
  size_type local_48;
  
  sVar8 = name.length_;
  pcVar6 = name.ptr_;
  __mutex.mu_ = pool->mutex_;
  if ((pthread_mutex_t *)__mutex.mu_ == (pthread_mutex_t *)0x0) {
    mu = (Mutex *)0x0;
  }
  else {
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex.mu_);
    if (iVar2 != 0) {
      std::__throw_system_error(iVar2);
    }
    if ((this->known_bad_files_)._M_h._M_element_count == 0 &&
        (this->known_bad_symbols_)._M_h._M_element_count == 0) {
      local_78.ptr_ = local_58;
      local_58[0].symbol_type_ = '\n';
      local_68.ptr_ = local_78.ptr_;
      local_50 = pcVar6;
      local_48 = sVar8;
      SVar11 = Symbol::full_name(&local_68);
      pcVar3 = SVar11.ptr_;
      if ((long)SVar11.length_ < 1) {
        _Var9 = 0;
      }
      else {
        pcVar10 = pcVar3 + SVar11.length_;
        _Var9 = 0;
        do {
          _Var9 = (long)*pcVar3 + _Var9 * 5;
          pcVar3 = pcVar3 + 1;
        } while (pcVar3 < pcVar10);
      }
      p_Var4 = std::
               _Hashtable<google::protobuf::Symbol,_google::protobuf::Symbol,_std::allocator<google::protobuf::Symbol>,_std::__detail::_Identity,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               ::_M_find_before_node
                         (&(this->symbols_by_name_)._M_h,
                          _Var9 % (this->symbols_by_name_)._M_h._M_bucket_count,&local_78,_Var9);
      if (p_Var4 == (__node_base_ptr)0x0) {
        p_Var7 = (_Hash_node_base *)&(anonymous_namespace)::kNullSymbol;
      }
      else {
        p_Var7 = (_Hash_node_base *)&(anonymous_namespace)::kNullSymbol;
        if (p_Var4->_M_nxt != (_Hash_node_base *)0x0) {
          p_Var7 = p_Var4->_M_nxt + 1;
        }
      }
      SVar5.ptr_ = (SymbolBase *)p_Var7->_M_nxt;
      if (((_Hash_node_base *)SVar5.ptr_ != (_Hash_node_base *)0x0) &&
         (*(char *)&((_Hash_node_base *)SVar5.ptr_)->_M_nxt != '\0')) goto LAB_003441c2;
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex.mu_);
    mu = pool->mutex_;
  }
  internal::MutexLockMaybe::MutexLockMaybe(&local_70,mu);
  if (pool->fallback_database_ != (DescriptorDatabase *)0x0) {
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::clear(&(this->known_bad_symbols_)._M_h);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::clear(&(this->known_bad_files_)._M_h);
  }
  local_58[0].symbol_type_ = '\n';
  local_78.ptr_ = local_58;
  local_68.ptr_ = local_58;
  local_50 = pcVar6;
  local_48 = sVar8;
  SVar11 = Symbol::full_name(&local_68);
  pcVar3 = SVar11.ptr_;
  local_60 = &(this->symbols_by_name_)._M_h;
  if ((long)SVar11.length_ < 1) {
    _Var9 = 0;
  }
  else {
    pcVar10 = pcVar3 + SVar11.length_;
    _Var9 = 0;
    do {
      _Var9 = (long)*pcVar3 + _Var9 * 5;
      pcVar3 = pcVar3 + 1;
    } while (pcVar3 < pcVar10);
  }
  p_Var4 = std::
           _Hashtable<google::protobuf::Symbol,_google::protobuf::Symbol,_std::allocator<google::protobuf::Symbol>,_std::__detail::_Identity,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
           ::_M_find_before_node
                     (local_60,_Var9 % (this->symbols_by_name_)._M_h._M_bucket_count,&local_78,_Var9
                     );
  if (p_Var4 == (__node_base_ptr)0x0) {
    p_Var7 = (_Hash_node_base *)&(anonymous_namespace)::kNullSymbol;
  }
  else {
    p_Var7 = (_Hash_node_base *)&(anonymous_namespace)::kNullSymbol;
    if (p_Var4->_M_nxt != (_Hash_node_base *)0x0) {
      p_Var7 = p_Var4->_M_nxt + 1;
    }
  }
  SVar5.ptr_ = (SymbolBase *)p_Var7->_M_nxt;
  if (((_Hash_node_base *)SVar5.ptr_ == (_Hash_node_base *)0x0) ||
     (*(char *)&((_Hash_node_base *)SVar5.ptr_)->_M_nxt == '\0')) {
    pool_00 = pool->underlay_;
    if (pool_00 != (DescriptorPool *)0x0) {
      SVar5 = FindByNameHelper((pool_00->tables_)._M_t.
                               super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                               .
                               super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>
                               ._M_head_impl,pool_00,name);
    }
    if ((((_Hash_node_base *)SVar5.ptr_ == (_Hash_node_base *)0x0) ||
        (*(char *)&((_Hash_node_base *)SVar5.ptr_)->_M_nxt == '\0')) &&
       (bVar1 = TryFindSymbolInFallbackDatabase(pool,name), bVar1)) {
      local_58[0].symbol_type_ = '\n';
      local_78.ptr_ = local_58;
      local_68.ptr_ = local_58;
      local_50 = pcVar6;
      local_48 = sVar8;
      SVar11 = Symbol::full_name(&local_68);
      pcVar6 = SVar11.ptr_;
      if ((long)SVar11.length_ < 1) {
        _Var9 = 0;
      }
      else {
        pcVar3 = pcVar6 + SVar11.length_;
        _Var9 = 0;
        do {
          _Var9 = (long)*pcVar6 + _Var9 * 5;
          pcVar6 = pcVar6 + 1;
        } while (pcVar6 < pcVar3);
      }
      p_Var4 = std::
               _Hashtable<google::protobuf::Symbol,_google::protobuf::Symbol,_std::allocator<google::protobuf::Symbol>,_std::__detail::_Identity,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               ::_M_find_before_node
                         (local_60,_Var9 % (this->symbols_by_name_)._M_h._M_bucket_count,&local_78,
                          _Var9);
      if (p_Var4 == (__node_base_ptr)0x0) {
        p_Var7 = (_Hash_node_base *)&(anonymous_namespace)::kNullSymbol;
      }
      else {
        p_Var7 = (_Hash_node_base *)&(anonymous_namespace)::kNullSymbol;
        if (p_Var4->_M_nxt != (_Hash_node_base *)0x0) {
          p_Var7 = p_Var4->_M_nxt + 1;
        }
      }
      SVar5.ptr_ = (SymbolBase *)p_Var7->_M_nxt;
    }
  }
  __mutex.mu_ = local_70.mu_;
  if ((pthread_mutex_t *)local_70.mu_ == (pthread_mutex_t *)0x0) {
    return (Symbol)SVar5.ptr_;
  }
LAB_003441c2:
  pthread_mutex_unlock((pthread_mutex_t *)__mutex.mu_);
  return (Symbol)SVar5.ptr_;
}

Assistant:

Symbol DescriptorPool::Tables::FindByNameHelper(const DescriptorPool* pool,
                                                StringPiece name) {
  if (pool->mutex_ != nullptr) {
    // Fast path: the Symbol is already cached.  This is just a hash lookup.
    ReaderMutexLock lock(pool->mutex_);
    if (known_bad_symbols_.empty() && known_bad_files_.empty()) {
      Symbol result = FindSymbol(name);
      if (!result.IsNull()) return result;
    }
  }
  MutexLockMaybe lock(pool->mutex_);
  if (pool->fallback_database_ != nullptr) {
    known_bad_symbols_.clear();
    known_bad_files_.clear();
  }
  Symbol result = FindSymbol(name);

  if (result.IsNull() && pool->underlay_ != nullptr) {
    // Symbol not found; check the underlay.
    result = pool->underlay_->tables_->FindByNameHelper(pool->underlay_, name);
  }

  if (result.IsNull()) {
    // Symbol still not found, so check fallback database.
    if (pool->TryFindSymbolInFallbackDatabase(name)) {
      result = FindSymbol(name);
    }
  }

  return result;
}